

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
::
emplace_decomposable<cs_impl::any,std::piecewise_construct_t_const&,std::tuple<cs_impl::any_const&>,std::tuple<cs::statement_block*&&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
          *this,any *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_cs_impl::any_&> *args_1,tuple<cs::statement_block_*&&> *args_2)

{
  long lVar1;
  size_t i;
  pair<unsigned_long,_bool> pVar2;
  
  pVar2 = raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          ::find_or_prepare_insert<cs_impl::any>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                      *)this,key,hashval);
  i = pVar2.first;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    emplace_at<std::piecewise_construct_t_const&,std::tuple<cs_impl::any_const&>,std::tuple<cs::statement_block*&&>>
              (this,i,args,args_1,args_2);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x10 + lVar1);
  __return_storage_ptr__->second = pVar2.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}